

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

bool r_exec::add(Context *context,uint16_t *index)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  Atom *pAVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  Atom aAStack_48 [4];
  float local_44;
  Atom local_40 [4];
  Atom local_3c [4];
  Atom local_38 [4];
  Atom local_34 [4];
  long *plVar4;
  
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  cVar1 = r_code::Atom::isFloat();
  if (cVar1 == '\0') {
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x39) {
      (**(code **)(*plVar6 + 0x20))(plVar6,0);
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x39) {
        pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
        lVar8 = r_code::Utils::GetTimestamp(pAVar7);
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        lVar9 = r_code::Utils::GetTimestamp(pAVar7);
        uVar2 = _Context::setTimestampResult(context->implementation,lVar9 + lVar8);
LAB_0018e09d:
        *index = uVar2;
        goto LAB_0018e0a1;
      }
      (**(code **)(*plVar6 + 0x20))(plVar6,0);
      cVar1 = r_code::Atom::isFloat();
      if (cVar1 != '\0') {
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        r_code::Atom::PlusInfinity();
        cVar1 = r_code::Atom::operator!=(pAVar7,aAStack_48);
        r_code::Atom::~Atom(aAStack_48);
        if (cVar1 != '\0') {
          pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
          uVar10 = r_code::Utils::GetTimestamp(pAVar7);
          local_44 = (float)uVar10;
          (**(code **)(*plVar6 + 0x20))(plVar6,0);
          fVar12 = (float)r_code::Atom::asFloat();
          uVar10 = (ulong)(fVar12 + local_44);
          uVar2 = _Context::setTimestampResult
                            (context->implementation,
                             (long)((fVar12 + local_44) - 9.223372e+18) & (long)uVar10 >> 0x3f |
                             uVar10);
          goto LAB_0018e09d;
        }
      }
    }
  }
  else {
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar1 = r_code::Atom::isFloat();
    if (cVar1 != '\0') {
      pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
      r_code::Atom::PlusInfinity();
      cVar1 = r_code::Atom::operator==(pAVar7,aAStack_48);
      r_code::Atom::~Atom(aAStack_48);
      if (cVar1 == '\0') {
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        r_code::Atom::PlusInfinity();
        cVar1 = r_code::Atom::operator==(pAVar7,aAStack_48);
        r_code::Atom::~Atom(aAStack_48);
        if (cVar1 == '\0') {
          (**(code **)(*plVar5 + 0x20))(plVar5,0);
          local_44 = (float)r_code::Atom::asFloat();
          (**(code **)(*plVar6 + 0x20))(plVar6,0);
          fVar12 = (float)r_code::Atom::asFloat();
          r_code::Atom::Float(local_44 + fVar12);
          uVar2 = Context::setAtomicResult(context,local_3c);
          *index = uVar2;
          pAVar7 = local_3c;
        }
        else {
          r_code::Atom::PlusInfinity();
          uVar2 = Context::setAtomicResult(context,local_38);
          *index = uVar2;
          pAVar7 = local_38;
        }
      }
      else {
        r_code::Atom::PlusInfinity();
        uVar2 = Context::setAtomicResult(context,local_34);
        *index = uVar2;
        pAVar7 = local_34;
      }
      r_code::Atom::~Atom(pAVar7);
LAB_0018e0a1:
      bVar11 = true;
      goto LAB_0018e0a4;
    }
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x39) {
      pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
      r_code::Atom::PlusInfinity();
      cVar1 = r_code::Atom::operator!=(pAVar7,aAStack_48);
      r_code::Atom::~Atom(aAStack_48);
      if (cVar1 != '\0') {
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        uVar10 = r_code::Utils::GetTimestamp(pAVar7);
        local_44 = (float)uVar10;
        (**(code **)(*plVar5 + 0x20))(plVar5,0);
        fVar12 = (float)r_code::Atom::asFloat();
        uVar10 = (ulong)(fVar12 + local_44);
        uVar2 = _Context::setTimestampResult
                          (context->implementation,
                           (long)((fVar12 + local_44) - 9.223372e+18) & (long)uVar10 >> 0x3f |
                           uVar10);
        goto LAB_0018e09d;
      }
    }
  }
  r_code::Atom::Nil();
  uVar2 = Context::setAtomicResult(context,local_40);
  *index = uVar2;
  r_code::Atom::~Atom(local_40);
  bVar11 = false;
LAB_0018e0a4:
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  return bVar11;
}

Assistant:

bool add(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            if (lhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::PlusInfinity());
                return true;
            }

            if (rhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::PlusInfinity());
                return true;
            }

            index = context.setAtomicResult(Atom::Float(lhs[0].asFloat() + rhs[0].asFloat()));
            return true;
        } else if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            if (lhs[0] != Atom::PlusInfinity()) {
                index = context.setTimestampResult(Utils::GetTimestamp(&rhs[0]) + lhs[0].asFloat());
                return true;
            }
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) + Utils::GetTimestamp(&rhs[0]));
            return true;
        } else if (rhs[0].isFloat()) {
            if (rhs[0] != Atom::PlusInfinity()) {
                index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) + rhs[0].asFloat());
                return true;
            }
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}